

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O3

void __thiscall string_to_float_Test::~string_to_float_Test(string_to_float_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(string, to_float)
{
    EXPECT_EQ(0.0f, ST_LITERAL("0").to_float());
    EXPECT_EQ(0.0f, ST_LITERAL("+0").to_float());
    EXPECT_EQ(0.0f, ST_LITERAL("-0").to_float());

    EXPECT_EQ(0.0, ST_LITERAL("0").to_double());
    EXPECT_EQ(0.0, ST_LITERAL("+0").to_double());
    EXPECT_EQ(0.0, ST_LITERAL("-0").to_double());

    EXPECT_EQ(-16.0f, ST_LITERAL("-16").to_float());
    EXPECT_EQ(16.0f, ST_LITERAL("16").to_float());
    EXPECT_EQ(16.0f, ST_LITERAL("+16").to_float());
    EXPECT_EQ(-16.0f, ST_LITERAL("-16.0").to_float());
    EXPECT_EQ(16.0f, ST_LITERAL("16.0").to_float());
    EXPECT_EQ(16.0f, ST_LITERAL("+16.0").to_float());
    EXPECT_EQ(-16.0f, ST_LITERAL("-1.6e1").to_float());
    EXPECT_EQ(16.0f, ST_LITERAL("1.6e1").to_float());
    EXPECT_EQ(16.0f, ST_LITERAL("+1.6e1").to_float());

    EXPECT_EQ(-16.0, ST_LITERAL("-16").to_double());
    EXPECT_EQ(16.0, ST_LITERAL("16").to_double());
    EXPECT_EQ(16.0, ST_LITERAL("+16").to_double());
    EXPECT_EQ(-16.0, ST_LITERAL("-16.0").to_double());
    EXPECT_EQ(16.0, ST_LITERAL("16.0").to_double());
    EXPECT_EQ(16.0, ST_LITERAL("+16.0").to_double());
    EXPECT_EQ(-16.0, ST_LITERAL("-1.6e1").to_double());
    EXPECT_EQ(16.0, ST_LITERAL("1.6e1").to_double());
    EXPECT_EQ(16.0, ST_LITERAL("+1.6e1").to_double());

    // Empty string is treated as zero for compatibility with strtod
    EXPECT_EQ(0.0f, ST::string().to_float());
    EXPECT_EQ(0.0, ST::string().to_double());
}